

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O0

vector<Comment,_std::allocator<Comment>_> * __thiscall Reddit::requestComments(Reddit *this)

{
  const_reference this_00;
  vector<Comment,_std::allocator<Comment>_> *in_RDI;
  Json resultJson;
  string *in_stack_000000d0;
  Client *in_stack_000000d8;
  Json *in_stack_000001a0;
  Reddit *in_stack_000001a8;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc0;
  
  __a = (allocator<char> *)&stack0xffffffffffffffbf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__a);
  Client::get(in_stack_000000d8,in_stack_000000d0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  extractComments(in_stack_000001a8,in_stack_000001a0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(this_00);
  return in_RDI;
}

Assistant:

std::vector<Comment> requestComments() {
			const Json resultJson = client.get("/r/cpp_questions/comments");
			return extractComments(resultJson["data"]["children"]);
		}